

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  undefined8 uVar1;
  undefined8 uVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
  *witness;
  uint rowIndex;
  _List_node_base *p_Var7;
  undefined4 local_4f4;
  undefined4 *local_4f0;
  _Base_ptr local_4e8;
  undefined **local_4e0;
  ulong local_4d8;
  shared_count sStack_4d0;
  undefined4 **local_4c8;
  undefined8 local_4c0;
  uint local_4b8 [2];
  undefined8 *local_4b0;
  _Base_ptr *local_4a8;
  undefined1 local_4a0 [8];
  undefined8 local_498;
  shared_count sStack_490;
  char *local_488;
  char *local_480;
  undefined **local_478;
  char *local_470;
  undefined8 *local_468;
  char *local_460;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3f8;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x30;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  ::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
              *)&m.matrix_,&local_3f8,m.colSettings_);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  bars1._M_t._M_impl._0_8_ =
       local_3f8.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)bars2._M_t._M_impl._0_8_;
  local_3f8.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
            (&local_3f8,&m);
  bars2._M_t._M_impl._0_8_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  build_longer_chain_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ();
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  uVar1 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars1._M_t._M_impl._0_8_ = bars2._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  bars2._M_t._M_impl._0_8_ = bars3._M_t._M_impl._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  uVar2 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)uVar1;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = SUB84(uVar1,4);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
  bars3._M_t._M_impl._0_8_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar2;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars3);
  uVar1 = bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
  if (bars2._M_t._M_impl._0_8_ != bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
    rowIndex = 0;
    witness = (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
               *)bars2._M_t._M_impl._0_8_;
    do {
      get_ordered_row<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
                ((column_content<typename_Matrix<Chain_barcode_options_with_row_access<true,_(Column_types)7,_false,_true,_true,_false,_true>_>::Column>
                  *)&bars1,&m,rowIndex);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
                          *)&bars1);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&bars1);
      witness = witness + 1;
      rowIndex = rowIndex + 1;
    } while (witness !=
             (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>_>
              *)uVar1);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&bars2);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((Chain_pairing_option *)
      m.matrix_.super_Chain_pairing_option.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != &m.matrix_.super_Chain_pairing_option) {
    p_Var7 = m.matrix_.super_Chain_pairing_option.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var7 + 1;
      __args_1 = (uint *)((long)&p_Var7[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      local_4b8[0] = *(uint *)&p_Var7[1]._M_prev;
      local_4c0 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_4c0,(uint *)((long)&local_4c0 + 4),local_4b8);
      p_Var7 = p_Var7->_M_next;
    } while ((Chain_pairing_option *)p_Var7 != &m.matrix_.super_Chain_pairing_option);
  }
  p_Var3 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x574);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4e8 = (_Base_ptr)&p_Var3[1]._M_parent;
  local_4f0 = &local_4f4;
  local_4f4 = 0;
  local_4a0[0] = *(int *)&p_Var3[1]._M_parent == 0;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4a8 = &local_4e8;
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4c8 = &local_4f0;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x575);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 0;
  local_4a0[0] = *(int *)&p_Var3[1].field_0x4 == 0;
  local_4e8 = (_Base_ptr)&p_Var3[1].field_0x4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x577);
  local_4e8 = p_Var3 + 1;
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 0xffffffff;
  local_4a0[0] = local_4e8->_M_color == ~_S_red;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x579);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 0;
  local_4a0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4e8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x57a);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 1;
  local_4a0[0] = *(int *)&p_Var5[1].field_0x4 == 1;
  local_4e8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x57b);
  local_4e8 = p_Var5 + 1;
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 3;
  local_4a0[0] = local_4e8->_M_color == 3;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x57d);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 0;
  local_4a0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4e8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x57e);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 2;
  local_4a0[0] = *(int *)&p_Var5[1].field_0x4 == 2;
  local_4e8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x57f);
  local_4e8 = p_Var5 + 1;
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 4;
  local_4a0[0] = local_4e8->_M_color == 4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x581);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 0;
  local_4a0[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_4e8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x582);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 7;
  local_4a0[0] = *(int *)&p_Var5[1].field_0x4 == 7;
  local_4e8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a8,0x583);
  local_4e8 = p_Var5 + 1;
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 8;
  local_4a0[0] = local_4e8->_M_color == 8;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x585);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 1;
  local_4a0[0] = *(int *)&p_Var5[1]._M_parent == 1;
  local_4e8 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x586);
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 5;
  local_4a0[0] = *(int *)&p_Var5[1].field_0x4 == 5;
  local_4e8 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_490);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_308,0x587);
  local_4e8 = p_Var5 + 1;
  local_470 = (char *)((ulong)local_470 & 0xffffffffffffff00);
  local_478 = &PTR__lazy_ostream_00230050;
  local_468 = &boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_4f4 = 6;
  local_4a0[0] = local_4e8->_M_color == 6;
  local_498 = 0;
  sStack_490.pi_ = (sp_counted_base *)0x0;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_480 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230010;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = &local_4e8;
  local_4f0 = &local_4f4;
  local_4d8 = local_4d8 & 0xffffffffffffff00;
  local_4e0 = &PTR__lazy_ostream_00230010;
  sStack_4d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = &local_4f0;
  boost::test_tools::tt_detail::report_assertion
            (local_4a0,&local_478,&local_488,0x587,1,2,2,"std::get<2>(*it)",&local_4c0,"6",
             &local_4e0);
  boost::detail::shared_count::~shared_count(&sStack_490);
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x589);
  local_4e0 = (undefined **)
              CONCAT71(local_4e0._1_7_,
                       (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_478 = (undefined **)0x1f65a0;
  local_470 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230250;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_340 = "";
  local_4a8 = (_Base_ptr *)&local_478;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_4e0 = (undefined **)CONCAT71(local_4e0._1_7_,bVar4);
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_478 = (undefined **)0x1f65b2;
  local_470 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230250;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_370 = "";
  local_4a8 = (_Base_ptr *)&local_478;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_380 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_4e0 = (undefined **)CONCAT71(local_4e0._1_7_,bVar4);
  local_4d8 = 0;
  sStack_4d0.pi_ = (sp_counted_base *)0x0;
  local_478 = (undefined **)0x1f65c1;
  local_470 = "";
  local_4b8[0] = local_4b8[0] & 0xffffff00;
  local_4c0 = &PTR__lazy_ostream_00230250;
  local_4b0 = &boost::unit_test::lazy_ostream::inst;
  local_4a8 = (_Base_ptr *)&local_478;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_4d0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<Chain_barcode_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_3f8);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}